

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

If_Obj_t * If_ManCreateAnd(If_Man_t *p,If_Obj_t *pFan0,If_Obj_t *pFan1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  If_Obj_t *pIVar5;
  If_Obj_t *pIVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  If_Obj_t *pIVar10;
  If_Obj_t *pIVar11;
  
  pIVar6 = pFan0;
  if (pFan0 != pFan1) {
    if ((If_Obj_t *)((ulong)pFan1 ^ 1) == pFan0) {
      pIVar6 = (If_Obj_t *)((ulong)p->pConst1 ^ 1);
    }
    else {
      pIVar10 = (If_Obj_t *)((ulong)pFan0 & 0xfffffffffffffffe);
      pIVar5 = p->pConst1;
      if (pIVar5 == pIVar10) {
        pIVar6 = pFan1;
        if (pIVar10 != pFan0) {
          pIVar6 = (If_Obj_t *)((ulong)pFan0 | 1);
        }
      }
      else {
        pIVar11 = (If_Obj_t *)((ulong)pFan1 & 0xfffffffffffffffe);
        if (pIVar5 == pIVar11) {
          if (pIVar5 != pFan1) {
            pIVar6 = (If_Obj_t *)((ulong)pIVar5 ^ 1);
          }
        }
        else {
          pIVar6 = If_ManSetupObj(p);
          *(uint *)pIVar6 =
               (*(uint *)pIVar6 & 0xffffffc0) + (((uint)pFan1 & 1) << 5 | ((uint)pFan0 & 1) << 4) +
               4;
          pIVar6->pFanin0 = pIVar10;
          uVar1 = pIVar10->nRefs;
          uVar3 = pIVar10->nVisits;
          pIVar10->nRefs = uVar1 + 1;
          pIVar10->nVisits = uVar3 + 1;
          pIVar10->nVisitsCopy = pIVar10->nVisitsCopy + 1;
          pIVar6->pFanin1 = pIVar11;
          uVar2 = pIVar11->nRefs;
          uVar4 = pIVar11->nVisits;
          pIVar11->nRefs = uVar2 + 1;
          pIVar11->nVisits = uVar4 + 1;
          pIVar11->nVisitsCopy = pIVar11->nVisitsCopy + 1;
          uVar7 = *(uint *)pIVar6;
          uVar9 = ((*(uint *)pIVar11 >> 6 ^ uVar7 >> 5) & (*(uint *)pIVar10 >> 6 ^ uVar7 >> 4) & 1)
                  << 6;
          *(uint *)pIVar6 = uVar7 & 0xffffffbf | uVar9;
          uVar8 = *(uint *)pIVar11 >> 0xd;
          if (*(uint *)pIVar11 >> 0xd < *(uint *)pIVar10 >> 0xd) {
            uVar8 = *(uint *)pIVar10 >> 0xd;
          }
          *(uint *)pIVar6 = (uVar7 & 0x1fbf | uVar9) + uVar8 * 0x2000 + 0x2000;
          uVar7 = uVar8 * 0x2000 + 0x2000 >> 0xd;
          if (p->nLevelMax < (int)uVar7) {
            p->nLevelMax = uVar7;
          }
          p->nObjs[4] = p->nObjs[4] + 1;
        }
      }
    }
  }
  return pIVar6;
}

Assistant:

If_Obj_t * If_ManCreateAnd( If_Man_t * p, If_Obj_t * pFan0, If_Obj_t * pFan1 )
{
    If_Obj_t * pObj;
    // perform constant propagation
    if ( pFan0 == pFan1 )
        return pFan0;
    if ( pFan0 == If_Not(pFan1) )
        return If_Not(p->pConst1);
    if ( If_Regular(pFan0) == p->pConst1 )
        return pFan0 == p->pConst1 ? pFan1 : If_Not(p->pConst1);
    if ( If_Regular(pFan1) == p->pConst1 )
        return pFan1 == p->pConst1 ? pFan0 : If_Not(p->pConst1);
    // get memory for the new object
    pObj = If_ManSetupObj( p );
    pObj->Type    = IF_AND;
    pObj->fCompl0 = If_IsComplement(pFan0); pFan0 = If_Regular(pFan0);
    pObj->fCompl1 = If_IsComplement(pFan1); pFan1 = If_Regular(pFan1);
    pObj->pFanin0 = pFan0; pFan0->nRefs++; pFan0->nVisits++; pFan0->nVisitsCopy++;
    pObj->pFanin1 = pFan1; pFan1->nRefs++; pFan1->nVisits++; pFan1->nVisitsCopy++;
    pObj->fPhase  = (pObj->fCompl0 ^ pFan0->fPhase) & (pObj->fCompl1 ^ pFan1->fPhase);
    pObj->Level   = 1 + IF_MAX( pFan0->Level, pFan1->Level );
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nObjs[IF_AND]++;
    return pObj;
}